

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O3

void __thiscall
boost::certify::store_ctx::store_ctx
          (store_ctx *this,certificate_chain *chain,certificate_store *store)

{
  int iVar1;
  uint uVar2;
  _Head_base<0UL,_x509_store_ctx_st_*,_false> _Var3;
  X509 *x509;
  ulong uVar4;
  ulong uVar5;
  undefined **local_60 [2];
  ulong local_50;
  error_category *local_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  _Var3._M_head_impl = (x509_store_ctx_st *)X509_STORE_CTX_new();
  (this->handle_)._M_t.super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>.
  _M_t.super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
  super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl = _Var3._M_head_impl;
  if ((X509_STORE_CTX *)_Var3._M_head_impl == (X509_STORE_CTX *)0x0) {
    uVar4 = ERR_get_error();
    if ((DAT_00109250 == -0x4d54ee85da8120f3) || (DAT_00109250 == -0x70502de1da3a1f65)) {
      uVar5 = (ulong)((int)uVar4 != 0);
    }
    else {
      uVar2 = (**(code **)(asio::error::get_ssl_category()::instance + 0x30))
                        (&asio::error::get_ssl_category()::instance,uVar4 & 0xffffffff);
      uVar5 = (ulong)uVar2;
    }
    std::runtime_error::runtime_error((runtime_error *)local_60,"");
    local_50 = (uVar5 & 0xff) << 0x20 | uVar4 & 0xffffffff;
    local_40._M_p = (pointer)((long)&((system_error *)local_60)->m_what + 0x10);
    local_60[0] = &PTR__system_error_00108a90;
    local_48 = (error_category *)&asio::error::get_ssl_category()::instance;
    local_38 = 0;
    local_30._M_local_buf[0] = '\0';
    throw_exception<boost::system::system_error>((system_error *)local_60);
  }
  x509 = (X509 *)OPENSSL_sk_value((chain->handle_)._M_t.
                                  super___uniq_ptr_impl<stack_st_X509,_boost::certify::certificate_chain::chain_free>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_stack_st_X509_*,_boost::certify::certificate_chain::chain_free>
                                  .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,0);
  iVar1 = X509_STORE_CTX_init((X509_STORE_CTX *)
                              (this->handle_)._M_t.
                              super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>
                              ._M_t.
                              super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>
                              .super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl,
                              (X509_STORE *)
                              (store->handle_)._M_t.
                              super___uniq_ptr_impl<x509_store_st,_boost::certify::certificate_store::free>
                              ._M_t.
                              super__Tuple_impl<0UL,_x509_store_st_*,_boost::certify::certificate_store::free>
                              .super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl,x509,
                              (stack_st_X509 *)
                              (chain->handle_)._M_t.
                              super___uniq_ptr_impl<stack_st_X509,_boost::certify::certificate_chain::chain_free>
                              ._M_t.
                              super__Tuple_impl<0UL,_stack_st_X509_*,_boost::certify::certificate_chain::chain_free>
                              .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
  if (iVar1 == 1) {
    X509_STORE_CTX_set_verify_cb
              ((X509_STORE_CTX *)
               (this->handle_)._M_t.
               super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>._M_t.
               super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
               super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl,
               verify_server_certificates);
    return;
  }
  uVar4 = ERR_get_error();
  if ((DAT_00109250 == -0x4d54ee85da8120f3) || (DAT_00109250 == -0x70502de1da3a1f65)) {
    uVar5 = (ulong)((int)uVar4 != 0);
  }
  else {
    uVar2 = (**(code **)(asio::error::get_ssl_category()::instance + 0x30))
                      (&asio::error::get_ssl_category()::instance,uVar4 & 0xffffffff);
    uVar5 = (ulong)uVar2;
  }
  std::runtime_error::runtime_error((runtime_error *)local_60,"");
  local_50 = (uVar5 & 0xff) << 0x20 | uVar4 & 0xffffffff;
  local_40._M_p = (pointer)((long)&((system_error *)local_60)->m_what + 0x10);
  local_60[0] = &PTR__system_error_00108a90;
  local_48 = (error_category *)&asio::error::get_ssl_category()::instance;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  throw_exception<boost::system::system_error>((system_error *)local_60);
}

Assistant:

explicit store_ctx(certificate_chain& chain, certificate_store& store)
      : handle_{::X509_STORE_CTX_new()}
    {
        system::error_code ec;
        if (handle_ == nullptr)
        {
            ec = {static_cast<int>(::ERR_get_error()),
                  boost::asio::error::get_ssl_category()};
            boost::throw_exception(system::system_error{ec});
        }

        X509* const cert = sk_X509_value(chain.native_handle(), 0);
        auto const ret = ::X509_STORE_CTX_init(
          handle_.get(), store.native_handle(), cert, chain.native_handle());
        if (ret != 1)
        {

            ec = {static_cast<int>(::ERR_get_error()),
                  boost::asio::error::get_ssl_category()};
            boost::throw_exception(system::system_error{ec});
        }
        ::X509_STORE_CTX_set_verify_cb(handle_.get(),
                                       &detail::verify_server_certificates);
    }